

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O0

wchar_t history_total_bytes(void)

{
  int iVar1;
  size_t sVar2;
  long local_30;
  size_t size;
  undefined1 local_20 [4];
  wchar_t curr_num;
  HistEvent ev;
  
  iVar1 = history(h,(HistEvent_conflict *)local_20,8);
  if (iVar1 == 0) {
    history(h,(HistEvent_conflict *)local_20,3);
    local_30 = 0;
    do {
      sVar2 = strlen((char *)ev._0_8_);
      local_30 = sVar2 + local_30;
      iVar1 = history(h,(HistEvent_conflict *)local_20,6);
    } while (iVar1 == 0);
    history(h,(HistEvent_conflict *)local_20,0x10,(ulong)(uint)local_20);
    ev.str._4_4_ = (wchar_t)local_30;
  }
  else {
    ev.str._4_4_ = L'\xffffffff';
  }
  return ev.str._4_4_;
}

Assistant:

int
history_total_bytes(void)
{
	HistEvent ev;
	int curr_num;
	size_t size;

	if (history(h, &ev, H_CURR) != 0)
		return -1;
	curr_num = ev.num;

	(void)history(h, &ev, H_FIRST);
	size = 0;
	do
		size += strlen(ev.str) * sizeof(*ev.str);
	while (history(h, &ev, H_NEXT) == 0);

	/* get to the same position as before */
	history(h, &ev, H_PREV_EVENT, curr_num);

	return (int)size;
}